

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

void __thiscall
TPZHybridizeHDiv::HybridizeGivenMesh
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *multiphysics,bool group_elements,
          double Lagrange_term_multiplier)

{
  TPZVec<TPZCompMesh_*> *pTVar1;
  undefined3 in_register_00000011;
  
  pTVar1 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  ComputePeriferalMaterialIds(this,pTVar1);
  pTVar1 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  ComputeNState(this,pTVar1);
  ReCreateMultiphysicsMesh(this,multiphysics,1.0);
  CreateInterfaceElements(this,multiphysics);
  if (CONCAT31(in_register_00000011,group_elements) != 0) {
    GroupandCondenseElements(&multiphysics->super_TPZCompMesh);
    return;
  }
  return;
}

Assistant:

void TPZHybridizeHDiv::HybridizeGivenMesh(TPZMultiphysicsCompMesh &multiphysics, bool group_elements, double Lagrange_term_multiplier)
{
    ComputePeriferalMaterialIds(multiphysics.MeshVector());
    ComputeNState(multiphysics.MeshVector());
    ReCreateMultiphysicsMesh(&multiphysics);
    CreateInterfaceElements(&multiphysics);
    if (group_elements) {
        GroupandCondenseElements(&multiphysics);
    }
}